

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O0

int mbedtls_rsa_complete(mbedtls_rsa_context *ctx)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  size_t sVar14;
  mbedtls_mpi *in_RDI;
  bool bVar15;
  int is_priv;
  int is_pub;
  int d_missing;
  int pq_missing;
  int n_missing;
  int have_QP;
  int have_DQ;
  int have_DP;
  int have_E;
  int have_D;
  int have_Q;
  int have_P;
  int have_N;
  int ret;
  undefined3 uVar16;
  undefined4 in_stack_ffffffffffffffb0;
  ushort uVar18;
  uint is_priv_00;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar19;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint low;
  int local_4;
  uint uVar17;
  
  low = 0;
  iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  uVar2 = (uint)(iVar1 != 0);
  iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  uVar3 = (uint)(iVar1 != 0);
  iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  uVar4 = (uint)(iVar1 != 0);
  iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  uVar5 = (uint)(iVar1 != 0);
  iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  uVar6 = (uint)(iVar1 != 0);
  iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  uVar7 = (uint)(iVar1 != 0);
  iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  uVar8 = (uint)(iVar1 != 0);
  iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  uVar9 = (uint)(iVar1 != 0);
  bVar15 = false;
  if (((uVar3 != 0) && (bVar15 = false, uVar4 != 0)) && (bVar15 = false, uVar5 != 0)) {
    bVar15 = uVar6 != 0;
  }
  uVar10 = (uint)bVar15;
  uVar18 = (ushort)(((uint)bVar15 << 0x18) >> 0x10);
  if (((uVar2 != 0) && (uVar18 = (ushort)(((uint)bVar15 << 0x18) >> 0x10), uVar3 == 0)) &&
     ((uVar18 = (ushort)(((uint)bVar15 << 0x18) >> 0x10), uVar4 == 0 &&
      (uVar18 = (ushort)(((uint)bVar15 << 0x18) >> 0x10), uVar5 != 0)))) {
    uVar18 = CONCAT11(bVar15,uVar6 != 0);
  }
  uVar11 = (uint)(byte)uVar18;
  uVar13 = (uint)uVar18 << 0x10;
  if (((uVar3 != 0) && (uVar13 = (uint)uVar18 << 0x10, uVar4 != 0)) &&
     (uVar13 = (uint)uVar18 << 0x10, uVar5 == 0)) {
    uVar13 = (uint)CONCAT21(uVar18,uVar6 != 0) << 8;
  }
  uVar12 = uVar13 >> 8 & 0xff;
  uVar17 = uVar13 >> 8;
  is_priv_00 = uVar17 << 8;
  if ((((uVar2 != 0) && (is_priv_00 = uVar17 << 8, uVar3 == 0)) &&
      (is_priv_00 = uVar17 << 8, uVar4 == 0)) && (is_priv_00 = uVar17 << 8, uVar5 == 0)) {
    is_priv_00 = CONCAT31((int3)(uVar13 >> 8),uVar6 != 0);
  }
  uVar13 = is_priv_00 & 0xff;
  uVar16 = (undefined3)in_stack_ffffffffffffffb0;
  uVar17 = CONCAT13(1,uVar16);
  if ((uVar10 == 0) && (uVar17 = CONCAT13(1,uVar16), uVar11 == 0)) {
    uVar17 = CONCAT13(uVar12 != 0,uVar16);
  }
  uVar19 = uVar17 >> 0x18;
  if ((uVar19 == 0) && (uVar13 == 0)) {
    local_4 = -0x4080;
  }
  else {
    if ((uVar2 == 0) && ((uVar3 != 0 && (uVar4 != 0)))) {
      low = mbedtls_mpi_mul_mpi(in_RDI,(mbedtls_mpi *)((ulong)low << 0x20),
                                (mbedtls_mpi *)CONCAT44(uVar3,uVar4));
      if (low != 0) {
        iVar1 = mbedtls_error_add(-0x4080,low,
                                  "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/third_party/mbedtls/library/rsa.cpp"
                                  ,0x304);
        return iVar1;
      }
      sVar14 = mbedtls_mpi_size((mbedtls_mpi *)0x87fd53);
      in_RDI->s = (short)sVar14;
      in_RDI->n = (short)(sVar14 >> 0x10);
      *(int *)&in_RDI->field_0xc = (int)(sVar14 >> 0x20);
    }
    if (uVar11 == 0) {
      if ((uVar12 != 0) &&
         (iVar1 = mbedtls_rsa_deduce_private_exponent
                            ((mbedtls_mpi *)CONCAT44(low,uVar2),(mbedtls_mpi *)CONCAT44(uVar3,uVar4)
                             ,(mbedtls_mpi *)CONCAT44(uVar5,uVar6),
                             (mbedtls_mpi *)CONCAT44(uVar7,uVar8)), iVar1 != 0)) {
        iVar1 = mbedtls_error_add(-0x4080,iVar1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/third_party/mbedtls/library/rsa.cpp"
                                  ,0x31a);
        return iVar1;
      }
    }
    else {
      iVar1 = mbedtls_rsa_deduce_primes(_have_Q,_have_E,_have_DQ,_n_missing,_d_missing);
      if (iVar1 != 0) {
        iVar1 = mbedtls_error_add(-0x4080,iVar1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/third_party/mbedtls/library/rsa.cpp"
                                  ,0x312);
        return iVar1;
      }
    }
    if ((uVar19 == 0) ||
       ((((uVar7 != 0 && (uVar8 != 0)) && (uVar9 != 0)) ||
        (iVar1 = mbedtls_rsa_deduce_crt
                           ((mbedtls_mpi *)CONCAT44(uVar3,uVar4),
                            (mbedtls_mpi *)CONCAT44(uVar5,uVar6),
                            (mbedtls_mpi *)CONCAT44(uVar7,uVar8),
                            (mbedtls_mpi *)CONCAT44(uVar9,uVar10),
                            (mbedtls_mpi *)CONCAT44(uVar11,uVar12),
                            (mbedtls_mpi *)CONCAT44(uVar13,uVar19)), iVar1 == 0)))) {
      local_4 = rsa_check_context((mbedtls_rsa_context *)CONCAT44(uVar13,uVar19),is_priv_00,uVar17);
    }
    else {
      local_4 = mbedtls_error_add(-0x4080,iVar1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/third_party/mbedtls/library/rsa.cpp"
                                  ,0x328);
    }
  }
  return local_4;
}

Assistant:

int mbedtls_rsa_complete(mbedtls_rsa_context *ctx)
{
    int ret = 0;
    int have_N, have_P, have_Q, have_D, have_E;
#if !defined(MBEDTLS_RSA_NO_CRT)
    int have_DP, have_DQ, have_QP;
#endif
    int n_missing, pq_missing, d_missing, is_pub, is_priv;

    have_N = (mbedtls_mpi_cmp_int(&ctx->N, 0) != 0);
    have_P = (mbedtls_mpi_cmp_int(&ctx->P, 0) != 0);
    have_Q = (mbedtls_mpi_cmp_int(&ctx->Q, 0) != 0);
    have_D = (mbedtls_mpi_cmp_int(&ctx->D, 0) != 0);
    have_E = (mbedtls_mpi_cmp_int(&ctx->E, 0) != 0);

#if !defined(MBEDTLS_RSA_NO_CRT)
    have_DP = (mbedtls_mpi_cmp_int(&ctx->DP, 0) != 0);
    have_DQ = (mbedtls_mpi_cmp_int(&ctx->DQ, 0) != 0);
    have_QP = (mbedtls_mpi_cmp_int(&ctx->QP, 0) != 0);
#endif

    /*
     * Check whether provided parameters are enough
     * to deduce all others. The following incomplete
     * parameter sets for private keys are supported:
     *
     * (1) P, Q missing.
     * (2) D and potentially N missing.
     *
     */

    n_missing  =              have_P &&  have_Q &&  have_D && have_E;
    pq_missing =   have_N && !have_P && !have_Q &&  have_D && have_E;
    d_missing  =              have_P &&  have_Q && !have_D && have_E;
    is_pub     =   have_N && !have_P && !have_Q && !have_D && have_E;

    /* These three alternatives are mutually exclusive */
    is_priv = n_missing || pq_missing || d_missing;

    if (!is_priv && !is_pub) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    /*
     * Step 1: Deduce N if P, Q are provided.
     */

    if (!have_N && have_P && have_Q) {
        if ((ret = mbedtls_mpi_mul_mpi(&ctx->N, &ctx->P,
                                       &ctx->Q)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_RSA_BAD_INPUT_DATA, ret);
        }

        ctx->len = mbedtls_mpi_size(&ctx->N);
    }

    /*
     * Step 2: Deduce and verify all remaining core parameters.
     */

    if (pq_missing) {
        ret = mbedtls_rsa_deduce_primes(&ctx->N, &ctx->E, &ctx->D,
                                        &ctx->P, &ctx->Q);
        if (ret != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_RSA_BAD_INPUT_DATA, ret);
        }

    } else if (d_missing) {
        if ((ret = mbedtls_rsa_deduce_private_exponent(&ctx->P,
                                                       &ctx->Q,
                                                       &ctx->E,
                                                       &ctx->D)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_RSA_BAD_INPUT_DATA, ret);
        }
    }

    /*
     * Step 3: Deduce all additional parameters specific
     *         to our current RSA implementation.
     */

#if !defined(MBEDTLS_RSA_NO_CRT)
    if (is_priv && !(have_DP && have_DQ && have_QP)) {
        ret = mbedtls_rsa_deduce_crt(&ctx->P,  &ctx->Q,  &ctx->D,
                                     &ctx->DP, &ctx->DQ, &ctx->QP);
        if (ret != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_RSA_BAD_INPUT_DATA, ret);
        }
    }
#endif /* MBEDTLS_RSA_NO_CRT */

    /*
     * Step 3: Basic sanity checks
     */

    return rsa_check_context(ctx, is_priv, 1);
}